

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer,char *caller)

{
  list_head *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  list_head *plVar4;
  list_head *plVar5;
  MppBufferService *this;
  MppBufferGroupImpl *pMVar6;
  MPP_RET MVar7;
  Autolock local_40;
  
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_ref_inc");
  }
  pthread_mutex_lock((pthread_mutex_t *)&buffer->lock);
  buffer->ref_count = buffer->ref_count + 1;
  buf_add_log(buffer,BUF_REF_INC,caller);
  MVar7 = MPP_OK;
  if (buffer->used == 0) {
    local_40.mLock = MppBufferService::get_lock();
    local_40.mEnabled = 1;
    if ((pthread_mutex_t *)local_40.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)local_40.mLock);
    }
    this = MppBufferService::get_instance();
    pMVar6 = MppBufferService::get_group_by_id(this,buffer->group_id);
    Mutex::Autolock::~Autolock(&local_40);
    if (pMVar6 == (MppBufferGroupImpl *)0x0) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"group",
                 "inc_buffer_ref",0x164);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      buffer->used = 1;
      _mpp_log_l(2,"mpp_buffer","unused buffer without group\n","inc_buffer_ref");
      MVar7 = MPP_NOK;
    }
    else {
      buffer->used = 1;
      pthread_mutex_lock((pthread_mutex_t *)&pMVar6->buf_lock);
      plVar1 = &buffer->list_status;
      plVar4 = (buffer->list_status).next;
      plVar5 = (buffer->list_status).prev;
      plVar4->prev = plVar5;
      plVar5->next = plVar4;
      (buffer->list_status).prev = plVar1;
      plVar4 = (pMVar6->list_used).prev;
      (pMVar6->list_used).prev = plVar1;
      (buffer->list_status).next = &pMVar6->list_used;
      (buffer->list_status).prev = plVar4;
      plVar4->next = plVar1;
      uVar2 = pMVar6->count_used;
      uVar3 = pMVar6->count_unused;
      pMVar6->count_used = uVar2 + 1;
      pMVar6->count_unused = uVar3 + -1;
      pthread_mutex_unlock((pthread_mutex_t *)&pMVar6->buf_lock);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&buffer->lock);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_ref_inc");
  }
  return MVar7;
}

Assistant:

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = inc_buffer_ref(buffer, caller);

    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}